

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL>::get
          (SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_1UL> *this,
          ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  Own<capnp::PipelineHook> local_28;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    local_28.disposer = (Disposer *)other[1].field_1.value.ownFile.content.disposer;
    local_28.ptr = (PipelineHook *)other[1].field_1.value.file;
    other[1].field_1.value.file = (char *)0x0;
    Own<capnp::PipelineHook>::operator=((Own<capnp::PipelineHook> *)(output + 1),&local_28);
    Own<capnp::PipelineHook>::dispose(&local_28);
  }
  else {
    local_28.disposer = (Disposer *)0x0;
    local_28.ptr = (PipelineHook *)0x0;
    Own<capnp::PipelineHook>::operator=((Own<capnp::PipelineHook> *)(output + 1),&local_28);
    Own<capnp::PipelineHook>::dispose(&local_28);
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }